

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_data_allocate_and_append_page
                    (ma_paged_audio_buffer_data *pData,ma_uint32 pageSizeInFrames,void *pInitialData
                    ,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  ma_paged_audio_buffer_page **in_RDX;
  undefined4 in_ESI;
  void *in_RDI;
  ma_paged_audio_buffer_page *pPage;
  ma_result result;
  ma_paged_audio_buffer_page *in_stack_00000080;
  ma_paged_audio_buffer_data *in_stack_00000088;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mVar1 = ma_paged_audio_buffer_data_allocate_page
                    ((ma_paged_audio_buffer_data *)pPage,
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                     (ma_allocation_callbacks *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  if (mVar1 == MA_SUCCESS) {
    mVar1 = ma_paged_audio_buffer_data_append_page(in_stack_00000088,in_stack_00000080);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_allocate_and_append_page(ma_paged_audio_buffer_data* pData, ma_uint32 pageSizeInFrames, const void* pInitialData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_result result;
    ma_paged_audio_buffer_page* pPage;

    result = ma_paged_audio_buffer_data_allocate_page(pData, pageSizeInFrames, pInitialData, pAllocationCallbacks, &pPage);
    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_paged_audio_buffer_data_append_page(pData, pPage);    /* <-- Should never fail. */
}